

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O2

void strbuf_init(strbuf_t *s,int len)

{
  char *pcVar1;
  size_t __size;
  
  __size = 0x3ff;
  if (0 < len) {
    __size = (size_t)(len + 1);
  }
  s->size = (int)__size;
  s->length = 0;
  s->increment = -2;
  s->dynamic = 0;
  s->reallocs = 0;
  s->debug = 0;
  pcVar1 = (char *)malloc(__size);
  s->buf = pcVar1;
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    return;
  }
  die("Out of memory");
}

Assistant:

void strbuf_init(strbuf_t *s, int len)
{
    int size;

    if (len <= 0)
        size = STRBUF_DEFAULT_SIZE;
    else
        size = len + 1;         /* \0 terminator */

    s->buf = NULL;
    s->size = size;
    s->length = 0;
    s->increment = STRBUF_DEFAULT_INCREMENT;
    s->dynamic = 0;
    s->reallocs = 0;
    s->debug = 0;

    s->buf = (char *)malloc(size);
    if (!s->buf)
        die("Out of memory");

    strbuf_ensure_null(s);
}